

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

void __thiscall depspawn::internal::arg_info::solve_overlap(arg_info *this,arg_info *other)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  arg_info *local_8;
  
  bVar1 = this->wr;
  bVar4 = true;
  if (bVar1 == false) {
    bVar4 = other->wr;
  }
  uVar2 = this->size;
  uVar3 = other->size;
  local_8 = other;
  if (uVar2 - uVar3 == 0) {
    other->wr = bVar4;
  }
  else if (uVar2 < uVar3) {
    bVar1 = other->wr;
    if (bVar4 != bVar1) {
      this->addr = this->addr + uVar2;
      this->size = uVar3 - uVar2;
      this->wr = bVar1;
      other->size = uVar2;
      other->wr = bVar4;
LAB_0010f395:
      insert_in_arglist(this,&local_8);
      return;
    }
  }
  else {
    if (bVar1 != bVar4) {
      this->addr = this->addr + uVar3;
      this->size = uVar2 - uVar3;
      goto LAB_0010f395;
    }
    other->wr = bVar1;
    other->size = uVar2;
  }
  LinkedListPool<depspawn::internal::arg_info,_true,_false>::free
            ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)Pool,this);
  return;
}

Assistant:

void arg_info::solve_overlap(arg_info *other)
    { size_t tmp_size;
      
      //fprintf(stderr, "%zu [%d %zu] [d %zu]\n", addr, other->wr, other->size, wr, size);
      
      const bool orwr = wr || other->wr;
      
      if(size == other->size) {
	other->wr = orwr;
	Pool.free(this);
      } else if (size < other->size) {
	
	if(orwr == other->wr)
	  Pool.free(this);
	else {
	  tmp_size = size;
	  
	  addr += size;
	  size = other->size - size;
	  wr = other->wr; //should be false
	  
	  other->size = tmp_size;
	  other->wr = orwr; //should be true
	  
	  insert_in_arglist(other);
	}
	
      } else { //size > other->size
	
	if(orwr == wr) {
	  other->wr = orwr;
	  other->size = size;
	  Pool.free(this);
	} else { //Should be other->wr = true, this->wr = false
	  tmp_size = other->size;
	  
	  addr += tmp_size;
	  size -= tmp_size;
	  
	  insert_in_arglist(other);
	}
	
      }
      
    }